

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int SMPI_Gather(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,int recvcount,
               SMPI_Datatype recvtype,int root,SMPI_Comm comm)

{
  undefined4 in_EDX;
  int ret;
  int in_stack_000001a4;
  SMPI_Datatype in_stack_000001a8;
  int in_stack_000001ac;
  void *in_stack_000001b0;
  int in_stack_000001bc;
  unsigned_long *in_stack_000001c0;
  SMPI_Comm in_stack_000001d0;
  int local_24;
  
  local_24 = 0;
  switch(in_EDX) {
  case 0:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Gather_Impl<int>
                         ((int *)in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,
                          in_stack_000001ac,in_stack_000001a8,in_stack_000001a4,in_stack_000001d0);
    break;
  case 1:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Gather_Impl<long>
                         ((long *)in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,
                          in_stack_000001ac,in_stack_000001a8,in_stack_000001a4,in_stack_000001d0);
    break;
  case 2:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Gather_Impl<unsigned_long>
                         (in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001ac,
                          in_stack_000001a8,in_stack_000001a4,in_stack_000001d0);
    break;
  case 3:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Gather_Impl<char>
                         ((char *)in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,
                          in_stack_000001ac,in_stack_000001a8,in_stack_000001a4,in_stack_000001d0);
    break;
  case 4:
    local_24 = anon_unknown.dwarf_df27d1::SMPI_Gather_Impl<unsigned_char>
                         ((uchar *)in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,
                          in_stack_000001ac,in_stack_000001a8,in_stack_000001a4,in_stack_000001d0);
  }
  return local_24;
}

Assistant:

int SMPI_Gather(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                int recvcount, SMPI_Datatype recvtype, int root, SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Gather_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcount,      \
                           recvtype, root, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}